

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

value_type __thiscall
jsoncons::jsonpath::detail::
abs_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::evaluate(abs_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 *args,error_code *ec)

{
  json_type jVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  const_reference this_00;
  type_conflict6 tVar4;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar5;
  vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_RSI;
  int __x;
  undefined8 in_RDI;
  type_conflict1 tVar7;
  optional<unsigned_long> oVar8;
  value_type vVar9;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> arg0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff58;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff60;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff68;
  error_code *in_stack_ffffffffffffff70;
  undefined1 local_40 [16];
  _Storage<unsigned_long,_true> local_30;
  undefined1 local_28;
  vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  sVar2 = std::
          vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          ::size(in_RDX);
  oVar8 = function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          ::arity(in_RSI);
  local_30._M_value =
       oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_28 = oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
  puVar3 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x6d0413);
  if (sVar2 == *puVar3) {
    this_00 = std::
              vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
              ::operator[](local_18,0);
    parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::value(this_00);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    jVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::type
                      (in_stack_ffffffffffffff68);
    if (jVar1 == int64_value) {
      tVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::as<long>
                        (in_stack_ffffffffffffff60);
      if (tVar4 < 0) {
        tVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::as<long>
                          (in_stack_ffffffffffffff60);
        std::abs((int)tVar4);
        jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        basic_json<long>(long,jsoncons::semantic_tag,std::enable_if<ext_traits::
        is_signed_integer<long>::value&&((sizeof(long))<=(8ul)),int>::type_
                  (in_stack_ffffffffffffff60,(long)in_stack_ffffffffffffff58,none,0x6d053d);
      }
      else {
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
    }
    else if (jVar1 == uint64_value) {
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    else if (jVar1 == double_value) {
      tVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::as<double>
                        (in_stack_ffffffffffffff60);
      if (tVar7 < 0.0) {
        __x = (int)local_40;
        pbVar5 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                 as<double>(in_stack_ffffffffffffff60);
        std::abs(__x);
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                  (pbVar5,(double)in_stack_ffffffffffffff58,none);
      }
      else {
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
    }
    else {
      std::error_code::operator=
                (in_stack_ffffffffffffff70,(jsonpath_errc)((ulong)in_stack_ffffffffffffff68 >> 0x20)
                );
      pbVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                (in_stack_ffffffffffffff60,pbVar5);
    }
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               0x6d05f8);
    uVar6 = extraout_RDX_00;
  }
  else {
    std::error_code::operator=
              (in_stack_ffffffffffffff70,(jsonpath_errc)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    uVar6 = extraout_RDX;
  }
  vVar9.field_0.int64_.val_ = uVar6;
  vVar9.field_0._0_8_ = in_RDI;
  return (value_type)vVar9.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
                 std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0= args[0].value();
            switch (arg0.type())
            {
                case json_type::uint64_value:
                    return arg0;
                case json_type::int64_value:
                {
                    return arg0.template as<int64_t>() >= 0 ? arg0 : value_type(std::abs(arg0.template as<int64_t>()), semantic_tag::none);
                }
                case json_type::double_value:
                {
                    return arg0.template as<double>() >= 0 ? arg0 : value_type(std::abs(arg0.template as<double>()), semantic_tag::none);
                }
                default:
                {
                    ec = jsonpath_errc::invalid_type;
                    return value_type::null();
                }
            }
        }